

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiWindow *in_RDI;
  bool bVar1;
  ImGuiWindow *unaff_retaddr;
  ImGuiWindow *display_front_window;
  ImGuiWindow *focus_front_window;
  ImGuiContext *g;
  ImGuiWindow *local_38;
  ImGuiWindow *local_30;
  ImGuiID local_24;
  ImGuiContext *window_00;
  
  window_00 = GImGui;
  if (GImGui->NavWindow != in_RDI) {
    GImGui->NavWindow = in_RDI;
    if ((in_RDI != (ImGuiWindow *)0x0) && ((window_00->NavDisableMouseHover & 1U) != 0)) {
      window_00->NavMousePosDirty = true;
    }
    window_00->NavInitRequest = false;
    if (in_RDI == (ImGuiWindow *)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = in_RDI->NavLastIds[0];
    }
    window_00->NavId = local_24;
    window_00->NavFocusScopeId = 0;
    window_00->NavIdIsAlive = false;
    window_00->NavLayer = ImGuiNavLayer_Main;
  }
  ClosePopupsOverWindow(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  bVar1 = true;
  if (in_RDI != (ImGuiWindow *)0x0) {
    bVar1 = in_RDI->RootWindow != (ImGuiWindow *)0x0;
  }
  if (!bVar1) {
    __assert_fail("window == __null || window->RootWindow != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x181b,"void ImGui::FocusWindow(ImGuiWindow *)");
  }
  if (in_RDI == (ImGuiWindow *)0x0) {
    local_30 = (ImGuiWindow *)0x0;
    local_38 = (ImGuiWindow *)0x0;
  }
  else {
    local_30 = in_RDI->RootWindow;
    local_38 = in_RDI->RootWindow;
  }
  if (((window_00->ActiveId != 0) && (window_00->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
     (window_00->ActiveIdWindow->RootWindow != local_30)) {
    ClearActiveID();
  }
  if ((in_RDI != (ImGuiWindow *)0x0) &&
     (BringWindowToFocusFront(local_38), ((in_RDI->Flags | local_38->Flags) & 0x2000U) == 0)) {
    BringWindowToDisplayFront((ImGuiWindow *)window_00);
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavInitRequest = false;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavFocusScopeId = 0;
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", window ? window->Name : NULL);
    }

    // Close popups if any
    ClosePopupsOverWindow(window, false);

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindow != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL; // NB: In docking branch this is window->RootWindowDockStop
    ImGuiWindow* display_front_window = window ? window->RootWindow : NULL;

    // Steal focus on active widgets
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}